

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_exchange.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int ranks_00;
  int ranks_01;
  int ranks_02;
  int iVar2;
  int rank;
  int ranks;
  int local_24;
  int local_20;
  undefined1 local_1c [4];
  undefined1 local_18 [8];
  
  MPI_Init(local_1c,local_18);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_24);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_20);
  if (local_20 == 3) {
    iVar1 = exchange(0,local_24,ranks_00);
    iVar2 = 1;
    if (iVar1 == 0) {
      iVar1 = exchange(1,local_24,ranks_01);
      if (iVar1 == 0) {
        iVar1 = exchange(-1,local_24,ranks_02);
        if (iVar1 == 0) {
          MPI_Finalize();
          iVar2 = 0;
        }
      }
    }
  }
  else {
    printf("test_kvtree_exchange, tests require 3 processes; actual # is %d\n");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv){
  int rank,ranks;
  MPI_Init(&argc, &argv);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &ranks);
  if( ranks != 3){
    printf("test_kvtree_exchange, tests require 3 processes; actual # is %d\n", ranks);
    return TEST_FAIL;
  }
  //call sraight kvtree_exchange
  if(exchange(0, rank, ranks) == TEST_FAIL) return TEST_FAIL;
  //call kvtree_exchange_direction RIGHT
  if(exchange(1, rank, ranks) == TEST_FAIL) return TEST_FAIL;
  //call kvtree_exchange_direction LEFT
  if(exchange(-1, rank, ranks) == TEST_FAIL) return TEST_FAIL;

  MPI_Finalize();
  return TEST_PASS;
}